

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.h
# Opt level: O2

void __thiscall refc<cg_box>::decrement(refc<cg_box> *this)

{
  int *piVar1;
  cg_box *this_00;
  
  piVar1 = this->count;
  if (*piVar1 == 1) {
    operator_delete(piVar1);
    this_00 = this->ptr;
    if (this_00 != (cg_box *)0x0) {
      cg_box::~cg_box(this_00);
    }
    operator_delete(this_00);
    return;
  }
  *piVar1 = *piVar1 + -1;
  return;
}

Assistant:

void decrement() {
        if (*count == 1) {
            delete count;
            delete ptr;
        } else {
            --*count;
        }
    }